

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPointPointShape.cpp
# Opt level: O3

void __thiscall
chrono::ChPointPointShape::Update
          (ChPointPointShape *this,ChPhysicsItem *updater,ChFrame<double> *frame)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  _func_int **pp_Var8;
  long lVar9;
  ChVector<double> *pCVar10;
  ChVector<double> *pCVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ChVector<double> pt1;
  ChVector<double> pt2;
  undefined1 local_98 [16];
  double local_88;
  ChVector<double> local_80;
  undefined1 local_68 [16];
  double local_58;
  ChVector<double> local_48;
  
  if (updater == (ChPhysicsItem *)0x0) {
    return;
  }
  pCVar11 = (ChVector<double> *)local_98;
  lVar7 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkMarkers::typeinfo,0);
  if (lVar7 == 0) {
    lVar7 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkDistance::typeinfo,0);
    if (lVar7 == 0) {
      lVar7 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkRevoluteSpherical::typeinfo,0);
      if (lVar7 == 0) {
        lVar7 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkTSDA::typeinfo,0);
        if (lVar7 == 0) {
          lVar7 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkMateGeneric::typeinfo,0);
          if (lVar7 == 0) {
            lVar7 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLink::typeinfo,0);
            if (lVar7 == 0) {
              return;
            }
            ChTransform<double>::TransformParentToLocal
                      ((ChVector<double> *)(*(long *)(lVar7 + 0x78) + 8),&(frame->coord).pos,
                       &frame->Amatrix);
            pCVar10 = &local_80;
            ChTransform<double>::TransformParentToLocal
                      ((ChVector<double> *)(*(long *)(lVar7 + 0x80) + 8),&(frame->coord).pos,
                       &frame->Amatrix);
            pp_Var8 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
          }
          else {
            ChTransform<double>::TransformLocalToParent
                      ((ChVector<double> *)(lVar7 + 0xc0),
                       (ChVector<double> *)(*(long *)(lVar7 + 0x78) + 8),
                       (ChMatrix33<double> *)(*(long *)(lVar7 + 0x78) + 0x40));
            ChTransform<double>::TransformLocalToParent
                      ((ChVector<double> *)(lVar7 + 0x148),
                       (ChVector<double> *)(*(long *)(lVar7 + 0x80) + 8),
                       (ChMatrix33<double> *)(*(long *)(lVar7 + 0x80) + 0x40));
            pCVar11 = (ChVector<double> *)local_68;
            ChTransform<double>::TransformParentToLocal
                      ((ChVector<double> *)local_98,&(frame->coord).pos,&frame->Amatrix);
            pCVar10 = &local_48;
            ChTransform<double>::TransformParentToLocal
                      (&local_80,&(frame->coord).pos,&frame->Amatrix);
            pp_Var8 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
          }
        }
        else {
          ChTransform<double>::TransformParentToLocal
                    ((ChVector<double> *)(lVar7 + 0xe8),&(frame->coord).pos,&frame->Amatrix);
          pCVar10 = &local_80;
          ChTransform<double>::TransformParentToLocal
                    ((ChVector<double> *)(lVar7 + 0x100),&(frame->coord).pos,&frame->Amatrix);
          pp_Var8 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
          pCVar11 = (ChVector<double> *)local_98;
        }
        goto LAB_00825d7d;
      }
      ChTransform<double>::TransformLocalToParent
                ((ChVector<double> *)(lVar7 + 0xb8),
                 (ChVector<double> *)(*(long *)(lVar7 + 0x78) + 8),
                 (ChMatrix33<double> *)(*(long *)(lVar7 + 0x78) + 0x40));
      local_80.m_data[1] = local_80.m_data[1] - (frame->coord).pos.m_data[1];
      local_80.m_data[0] = local_80.m_data[0] - (frame->coord).pos.m_data[0];
      local_80.m_data[2] = local_80.m_data[2] - (frame->coord).pos.m_data[2];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_80.m_data[0];
      auVar28._8_8_ = 0;
      auVar28._0_8_ =
           local_80.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar1 = vfmadd231sd_fma(auVar28,auVar14,auVar3);
      auVar20._0_8_ =
           local_80.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar20._8_8_ =
           local_80.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar15._8_8_ = local_80.m_data[0];
      auVar15._0_8_ = local_80.m_data[0];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_80.m_data[2];
      auVar2 = vfmadd231sd_fma(auVar1,auVar25,auVar4);
      auVar1 = vfmadd132pd_fma(auVar15,auVar20,
                               *(undefined1 (*) [16])
                                (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array);
      auVar21._8_8_ = local_80.m_data[2];
      auVar21._0_8_ = local_80.m_data[2];
      local_98 = vfmadd132pd_fma(auVar21,auVar1,
                                 *(undefined1 (*) [16])
                                  ((frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 6));
      local_88 = auVar2._0_8_;
      lVar9 = *(long *)(lVar7 + 0x80);
      pCVar11 = (ChVector<double> *)(lVar7 + 0xd0);
    }
    else {
      ChTransform<double>::TransformLocalToParent
                ((ChVector<double> *)(lVar7 + 200),(ChVector<double> *)(*(long *)(lVar7 + 0x78) + 8)
                 ,(ChMatrix33<double> *)(*(long *)(lVar7 + 0x78) + 0x40));
      local_80.m_data[1] = local_80.m_data[1] - (frame->coord).pos.m_data[1];
      local_80.m_data[0] = local_80.m_data[0] - (frame->coord).pos.m_data[0];
      local_80.m_data[2] = local_80.m_data[2] - (frame->coord).pos.m_data[2];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_80.m_data[0];
      auVar27._8_8_ = 0;
      auVar27._0_8_ =
           local_80.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar1 = vfmadd231sd_fma(auVar27,auVar12,auVar1);
      auVar18._0_8_ =
           local_80.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar18._8_8_ =
           local_80.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar13._8_8_ = local_80.m_data[0];
      auVar13._0_8_ = local_80.m_data[0];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_80.m_data[2];
      auVar2 = vfmadd231sd_fma(auVar1,auVar24,auVar2);
      auVar1 = vfmadd132pd_fma(auVar13,auVar18,
                               *(undefined1 (*) [16])
                                (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array);
      auVar19._8_8_ = local_80.m_data[2];
      auVar19._0_8_ = local_80.m_data[2];
      local_98 = vfmadd132pd_fma(auVar19,auVar1,
                                 *(undefined1 (*) [16])
                                  ((frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 6));
      local_88 = auVar2._0_8_;
      lVar9 = *(long *)(lVar7 + 0x80);
      pCVar11 = (ChVector<double> *)(lVar7 + 0xe0);
    }
    ChTransform<double>::TransformLocalToParent
              (pCVar11,(ChVector<double> *)(lVar9 + 8),(ChMatrix33<double> *)(lVar9 + 0x40));
    pCVar10 = (ChVector<double> *)local_68;
    local_48.m_data[1] = local_48.m_data[1] - (frame->coord).pos.m_data[1];
    local_48.m_data[0] = local_48.m_data[0] - (frame->coord).pos.m_data[0];
    local_48.m_data[2] = local_48.m_data[2] - (frame->coord).pos.m_data[2];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_48.m_data[0];
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         local_48.m_data[1] *
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar1 = vfmadd231sd_fma(auVar29,auVar16,auVar5);
    auVar22._0_8_ =
         local_48.m_data[1] *
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar22._8_8_ =
         local_48.m_data[1] *
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar17._8_8_ = local_48.m_data[0];
    auVar17._0_8_ = local_48.m_data[0];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_48.m_data[2];
    auVar2 = vfmadd231sd_fma(auVar1,auVar26,auVar6);
    auVar1 = vfmadd132pd_fma(auVar17,auVar22,
                             *(undefined1 (*) [16])
                              (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar23._8_8_ = local_48.m_data[2];
    auVar23._0_8_ = local_48.m_data[2];
    local_68 = vfmadd132pd_fma(auVar23,auVar1,
                               *(undefined1 (*) [16])
                                ((frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 6));
    local_58 = auVar2._0_8_;
    pp_Var8 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
    pCVar11 = (ChVector<double> *)local_98;
  }
  else {
    ChTransform<double>::TransformParentToLocal
              ((ChVector<double> *)(*(long *)(lVar7 + 0xb8) + 0x250),&(frame->coord).pos,
               &frame->Amatrix);
    pCVar10 = &local_80;
    ChTransform<double>::TransformParentToLocal
              ((ChVector<double> *)(*(long *)(lVar7 + 0xc0) + 0x250),&(frame->coord).pos,
               &frame->Amatrix);
    pp_Var8 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
    pCVar11 = (ChVector<double> *)local_98;
  }
LAB_00825d7d:
  (*pp_Var8[5])(this,pCVar11,pCVar10);
  return;
}

Assistant:

void ChPointPointShape::Update(ChPhysicsItem* updater, const ChFrame<>& frame) {
    // Extract two positions from updater if it has any, and then update line geometry from these positions.
    if (auto link_markers = dynamic_cast<ChLinkMarkers*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_markers->GetMarker1()->GetAbsCoord().pos),
                           frame.TransformPointParentToLocal(link_markers->GetMarker2()->GetAbsCoord().pos));
    } else if (auto link_dist = dynamic_cast<ChLinkDistance*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_dist->GetEndPoint1Abs()),
                           frame.TransformPointParentToLocal(link_dist->GetEndPoint2Abs()));
    } else if (auto link_rs = dynamic_cast<ChLinkRevoluteSpherical*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_rs->GetPoint1Abs()),
                           frame.TransformPointParentToLocal(link_rs->GetPoint2Abs()));
    } else if (auto link_tsda = dynamic_cast<ChLinkTSDA*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_tsda->GetPoint1Abs()),
                           frame.TransformPointParentToLocal(link_tsda->GetPoint2Abs()));
    } else if (auto link_mate = dynamic_cast<ChLinkMateGeneric*>(updater)) {
        auto pt1 = link_mate->GetBody1()->TransformPointLocalToParent(link_mate->GetFrame1().GetPos());
        auto pt2 = link_mate->GetBody2()->TransformPointLocalToParent(link_mate->GetFrame2().GetPos());
        UpdateLineGeometry(frame.TransformPointParentToLocal(pt1), frame.TransformPointParentToLocal(pt2));
    } else if (auto link = dynamic_cast<ChLink*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link->GetBody1()->GetPos()),
                           frame.TransformPointParentToLocal(link->GetBody2()->GetPos()));
    }
}